

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O3

void Assimp::ExportSceneCollada
               (char *pFile,IOSystem *pIOSystem,aiScene *pScene,ExportProperties *param_4)

{
  _Alloc_hider _Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar4;
  runtime_error *prVar5;
  string file;
  string path;
  ColladaExporter iDoTheExportThing;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  string local_2d8;
  undefined1 local_2b8 [40];
  long local_290;
  byte abStack_270 [584];
  long *plVar3;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,pFile,(allocator<char> *)&local_2f8);
  DefaultIOSystem::absolutePath(&local_2d8,(string *)local_2b8);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2b8,pFile,(allocator<char> *)&local_338);
  DefaultIOSystem::completeBaseName(&local_2f8,(string *)local_2b8);
  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  ColladaExporter::ColladaExporter
            ((ColladaExporter *)local_2b8,pScene,pIOSystem,&local_2d8,&local_2f8);
  if ((abStack_270[*(long *)(local_290 + -0x18)] & 5) == 0) {
    iVar2 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wt");
    plVar3 = (long *)CONCAT44(extraout_var,iVar2);
    if (plVar3 != (long *)0x0) {
      std::__cxx11::stringbuf::str();
      _Var1._M_p = local_338._M_dataplus._M_p;
      uVar4 = std::ostream::tellp();
      (**(code **)(*plVar3 + 0x18))(plVar3,_Var1._M_p,uVar4,1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
      }
      (**(code **)(*plVar3 + 8))(plVar3);
      ColladaExporter::~ColladaExporter((ColladaExporter *)local_2b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pFile,&local_339);
    std::operator+(&local_338,"could not open output .dae file: ",&local_318);
    std::runtime_error::runtime_error(prVar5,(string *)&local_338);
    *(undefined ***)prVar5 = &PTR__runtime_error_008bf448;
    __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,pFile,&local_339);
  std::operator+(&local_338,"output data creation failed. Most likely the file became too large: ",
                 &local_318);
  std::runtime_error::runtime_error(prVar5,(string *)&local_338);
  *(undefined ***)prVar5 = &PTR__runtime_error_008bf448;
  __cxa_throw(prVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ExportSceneCollada(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene, const ExportProperties* /*pProperties*/) {
    std::string path = DefaultIOSystem::absolutePath(std::string(pFile));
    std::string file = DefaultIOSystem::completeBaseName(std::string(pFile));

    // invoke the exporter
    ColladaExporter iDoTheExportThing( pScene, pIOSystem, path, file);
    
    if (iDoTheExportThing.mOutput.fail()) {
        throw DeadlyExportError("output data creation failed. Most likely the file became too large: " + std::string(pFile));
    }

    // we're still here - export successfully completed. Write result to the given IOSYstem
    std::unique_ptr<IOStream> outfile (pIOSystem->Open(pFile,"wt"));
    if(outfile == NULL) {
        throw DeadlyExportError("could not open output .dae file: " + std::string(pFile));
    }

    // XXX maybe use a small wrapper around IOStream that behaves like std::stringstream in order to avoid the extra copy.
    outfile->Write( iDoTheExportThing.mOutput.str().c_str(), static_cast<size_t>(iDoTheExportThing.mOutput.tellp()),1);
}